

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

int mbedtls_blowfish_crypt_cfb64
              (mbedtls_blowfish_context *ctx,int mode,size_t length,size_t *iv_off,uchar *iv,
              uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar4 = *iv_off;
  iVar3 = -0x16;
  if (uVar4 < 8) {
    if (mode == 0) {
      if (length != 0) {
        sVar5 = 0;
        do {
          if (uVar4 == 0) {
            mbedtls_blowfish_crypt_ecb(ctx,1,iv,iv);
          }
          bVar1 = input[sVar5];
          output[sVar5] = iv[uVar4] ^ bVar1;
          iv[uVar4] = bVar1;
          uVar4 = (ulong)((int)uVar4 + 1U & 7);
          sVar5 = sVar5 + 1;
        } while (length != sVar5);
      }
    }
    else if (length != 0) {
      sVar5 = 0;
      do {
        if (uVar4 == 0) {
          mbedtls_blowfish_crypt_ecb(ctx,1,iv,iv);
        }
        bVar1 = input[sVar5];
        bVar2 = iv[uVar4];
        output[sVar5] = bVar1 ^ bVar2;
        iv[uVar4] = bVar1 ^ bVar2;
        uVar4 = (ulong)((int)uVar4 + 1U & 7);
        sVar5 = sVar5 + 1;
      } while (length != sVar5);
    }
    *iv_off = uVar4;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_blowfish_crypt_cfb64( mbedtls_blowfish_context *ctx,
                       int mode,
                       size_t length,
                       size_t *iv_off,
                       unsigned char iv[MBEDTLS_BLOWFISH_BLOCKSIZE],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c;
    size_t n;

    BLOWFISH_VALIDATE_RET( ctx != NULL );
    BLOWFISH_VALIDATE_RET( mode == MBEDTLS_BLOWFISH_ENCRYPT ||
                           mode == MBEDTLS_BLOWFISH_DECRYPT );
    BLOWFISH_VALIDATE_RET( iv     != NULL );
    BLOWFISH_VALIDATE_RET( iv_off != NULL );
    BLOWFISH_VALIDATE_RET( length == 0 || input  != NULL );
    BLOWFISH_VALIDATE_RET( length == 0 || output != NULL );

    n = *iv_off;
    if( n >= 8 )
        return( MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA );

    if( mode == MBEDTLS_BLOWFISH_DECRYPT )
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_blowfish_crypt_ecb( ctx, MBEDTLS_BLOWFISH_ENCRYPT, iv, iv );

            c = *input++;
            *output++ = (unsigned char)( c ^ iv[n] );
            iv[n] = (unsigned char) c;

            n = ( n + 1 ) % MBEDTLS_BLOWFISH_BLOCKSIZE;
        }
    }
    else
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_blowfish_crypt_ecb( ctx, MBEDTLS_BLOWFISH_ENCRYPT, iv, iv );

            iv[n] = *output++ = (unsigned char)( iv[n] ^ *input++ );

            n = ( n + 1 ) % MBEDTLS_BLOWFISH_BLOCKSIZE;
        }
    }

    *iv_off = n;

    return( 0 );
}